

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestCycleInEdgesButNotInNodes1::Run(GraphTestCycleInEdgesButNotInNodes1 *this)

{
  Test *pTVar1;
  bool bVar2;
  Node *initial_node;
  allocator<char> local_69;
  string local_68;
  ManifestParserOptions local_38;
  undefined1 local_30 [8];
  string err;
  GraphTestCycleInEdgesButNotInNodes1 *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  ManifestParserOptions::ManifestParserOptions(&local_38);
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,"build a b: cat a\n",
              local_38);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"b",&local_69);
  initial_node = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_68);
  bVar2 = DependencyScan::RecomputeDirty
                    (&(this->super_GraphTest).scan_,initial_node,
                     (vector<Node_*,_std::allocator<Node_*>_> *)0x0,(string *)local_30);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc",
             0x185,"scan_.RecomputeDirty(GetNode(\"b\"), NULL, &err)");
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("dependency cycle: a -> a",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
                     ,0x186,"\"dependency cycle: a -> a\" == err");
  if (!bVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(GraphTest, CycleInEdgesButNotInNodes1) {
  string err;
  AssertParse(&state_,
"build a b: cat a\n");
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("b"), NULL, &err));
  ASSERT_EQ("dependency cycle: a -> a", err);
}